

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_to_uni(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  int32_t iVar6;
  size_t sVar7;
  uint uVar8;
  size_t idx;
  long lVar9;
  char *p;
  ulong bytecnt;
  bool bVar10;
  utf8_ptr local_58;
  wchar_t local_4c;
  size_t bytelen;
  vm_val_t ele_val;
  
  local_58.p_ = (char *)0x0;
  if (in_argc == (uint *)0x0) {
    bVar10 = true;
  }
  else {
    bVar10 = *in_argc == 0;
  }
  if ((getp_to_uni(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar5 = __cxa_guard_acquire(&getp_to_uni(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar5 != 0)) {
    getp_to_uni::desc.min_argc_ = 0;
    getp_to_uni::desc.opt_argc_ = 1;
    getp_to_uni::desc.varargs_ = 0;
    __cxa_guard_release(&getp_to_uni(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_to_uni::desc);
  if (iVar5 != 0) {
    return 1;
  }
  if (bVar10) {
    lVar9 = 1;
  }
  else {
    iVar6 = CVmBif::pop_long_val();
    lVar9 = (long)iVar6;
  }
  pvVar4 = sp_;
  uVar3 = *(undefined4 *)&self_val->field_0x4;
  aVar2 = self_val->val;
  sp_ = sp_ + 1;
  pvVar4->typ = self_val->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar3;
  pvVar4->val = aVar2;
  bytecnt = (ulong)*(ushort *)str;
  p = str + 2;
  local_58.p_ = p;
  bytelen = bytecnt;
  if (lVar9 < 0) {
    sVar7 = utf8_ptr::s_len(p,bytecnt);
    lVar9 = lVar9 + sVar7 + 1;
  }
  if (bVar10) {
    sVar7 = utf8_ptr::s_len(p,bytecnt);
    local_4c = CVmObjList::create(0,sVar7);
    uVar8 = local_4c & 0xfff;
    pCVar1 = G_obj_table_X.pages_[(uint)local_4c >> 0xc];
    for (idx = 0; sVar7 != idx; idx = idx + 1) {
      ele_val.val.intval = utf8_ptr::s_getch(p);
      ele_val.typ = VM_INT;
      CVmObjList::cons_set_element((CVmObjList *)(pCVar1 + uVar8),idx,&ele_val);
      p = utf8_ptr::s_inc(p);
    }
    retval->typ = VM_OBJ;
  }
  else {
    while ((1 < lVar9 && (bytecnt != 0))) {
      lVar9 = lVar9 + -1;
      utf8_ptr::inc(&local_58,&bytelen);
      bytecnt = bytelen;
    }
    if (lVar9 != 1 || bytecnt == 0) {
      retval->typ = VM_NIL;
      goto LAB_00272baa;
    }
    local_4c = utf8_ptr::s_getch(local_58.p_);
    retval->typ = VM_INT;
  }
  (retval->val).obj = local_4c;
LAB_00272baa:
  sp_ = sp_ + -1;
  return 1;
}

Assistant:

int CVmObjString::getp_to_uni(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *str, uint *in_argc)
{
    size_t bytelen;
    long idx = 1;
    utf8_ptr p;

    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* retrieve the index argument if present */
    if (argc >= 1)
        idx = CVmBif::pop_long_val(vmg0_);

    /* push a self-reference as GC protection */
    G_stk->push(self_val);

    /* get and skip the string's length prefix */
    bytelen = vmb_get_len(str);
    str += VMB_LEN;

    /* set up a utf8 pointer to the string */
    p.set((char *)str);

    /* if the index is negative, it's an index from the end of the string */
    if (idx < 0)
        idx += p.len(bytelen) + 1;

    /* check for an index argument */
    if (argc >= 1)
    {
        /* skip through the string until we get to the desired index */
        for ( ; idx > 1 && bytelen != 0 ; --idx, p.inc(&bytelen)) ;

        /* check to see if we have a character available */
        if (idx == 1 && bytelen != 0)
        {
            /* the index is valid - return the character here */
            retval->set_int((long)p.getch());
        }
        else
        {
            /* 
             *   the index is past the end of the string or is less than 1
             *   - return nil to indicate that there's no character here 
             */
            retval->set_nil();
        }
    }
    else
    {
        size_t charlen;
        vm_obj_id_t lst_obj;
        CVmObjList *lst;
        size_t i;

        /* 
         *   There's no index argument - they want a list of all of the
         *   code points in the string.  First, get the number of
         *   characters in the string.  
         */
        charlen = p.len(bytelen);

        /* create a list to hold the results */
        lst_obj = CVmObjList::create(vmg_ FALSE, charlen);
        lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

        /* set the list's elements to the unicode characters values */
        for (i = 0 ; i < charlen ; ++i, p.inc())
        {
            wchar_t ch;
            vm_val_t ele_val;

            /* get this character */
            ch = p.getch();

            /* set this list element */
            ele_val.set_int((long)ch);
            lst->cons_set_element(i, &ele_val);
        }

        /* return the list object */
        retval->set_obj(lst_obj);
    }
    
    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}